

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O1

void PaUtil_GroupFreeMemory(PaUtilAllocationGroup *group,void *buffer)

{
  PaUtilAllocationGroupLink *pPVar1;
  PaUtilAllocationGroupLink *pPVar2;
  PaUtilAllocationGroupLink *pPVar3;
  
  if (buffer == (void *)0x0) {
    return;
  }
  pPVar1 = (PaUtilAllocationGroupLink *)&group->allocations;
  pPVar2 = (PaUtilAllocationGroupLink *)0x0;
  do {
    pPVar3 = pPVar2;
    pPVar1 = pPVar1->next;
    if (pPVar1 == (PaUtilAllocationGroupLink *)0x0) goto LAB_00110059;
    pPVar2 = pPVar1;
  } while (pPVar1->buffer != buffer);
  pPVar2 = (PaUtilAllocationGroupLink *)&group->allocations;
  if (pPVar3 != (PaUtilAllocationGroupLink *)0x0) {
    pPVar2 = pPVar3;
  }
  pPVar2->next = pPVar1->next;
  pPVar1->buffer = (void *)0x0;
  pPVar1->next = group->spareLinks;
  group->spareLinks = pPVar1;
LAB_00110059:
  PaUtil_FreeMemory(buffer);
  return;
}

Assistant:

void PaUtil_GroupFreeMemory( PaUtilAllocationGroup* group, void *buffer )
{
    struct PaUtilAllocationGroupLink *current = group->allocations;
    struct PaUtilAllocationGroupLink *previous = 0;

    if( buffer == 0 )
        return;

    /* find the right link and remove it */
    while( current )
    {
        if( current->buffer == buffer )
        {
            if( previous )
            {
                previous->next = current->next;
            }
            else
            {
                group->allocations = current->next;
            }

            current->buffer = 0;
            current->next = group->spareLinks;
            group->spareLinks = current;

            break;
        }
        
        previous = current;
        current = current->next;
    }

    PaUtil_FreeMemory( buffer ); /* free the memory whether we found it in the list or not */
}